

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

void solver_cancel_until(solver_t *s,uint level)

{
  vec_uint_t *p;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_18;
  uint var;
  uint i;
  uint level_local;
  solver_t *s_local;
  
  uVar1 = solver_dlevel(s);
  if (level < uVar1) {
    local_18 = vec_uint_size(s->trail);
    while( true ) {
      uVar1 = local_18 - 1;
      uVar2 = vec_uint_at(s->trail_lim,level);
      if (local_18 <= uVar2) break;
      uVar2 = vec_uint_at(s->trail,uVar1);
      uVar2 = lit2var(uVar2);
      vec_char_assign(s->assigns,uVar2,'\x03');
      vec_uint_assign(s->reasons,uVar2,0xffffffff);
      iVar3 = heap_in_heap(s->var_order,uVar2);
      local_18 = uVar1;
      if (iVar3 == 0) {
        heap_insert(s->var_order,uVar2);
      }
    }
    uVar1 = vec_uint_at(s->trail_lim,level);
    s->i_qhead = uVar1;
    p = s->trail;
    uVar1 = vec_uint_at(s->trail_lim,level);
    vec_uint_shrink(p,uVar1);
    vec_uint_shrink(s->trail_lim,level);
  }
  return;
}

Assistant:

void solver_cancel_until(solver_t *s, unsigned level)
{
    unsigned i;

    if (solver_dlevel(s) <= level)
        return;
    for (i = vec_uint_size(s->trail); i --> vec_uint_at(s->trail_lim, level);) {
        unsigned var = lit2var(vec_uint_at(s->trail, i));

        vec_char_assign(s->assigns, var, SATOKO_VAR_UNASSING);
        vec_uint_assign(s->reasons, var, UNDEF);
        if (!heap_in_heap(s->var_order, var))
            heap_insert(s->var_order, var);
    }
    s->i_qhead = vec_uint_at(s->trail_lim, level);
    vec_uint_shrink(s->trail, vec_uint_at(s->trail_lim, level));
    vec_uint_shrink(s->trail_lim, level);
}